

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

vm_lookup_val * __thiscall
CVmObjLookupTable::find_entry
          (CVmObjLookupTable *this,vm_val_t *key,uint *hashval_p,vm_lookup_val **prv_entry_p)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  vm_lookup_val *pvVar5;
  vm_lookup_val *this_00;
  
  pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
  uVar3 = vm_val_t::calc_hash(key,0);
  uVar2 = (ulong)uVar3 % (ulong)*(uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  if (hashval_p != (uint *)0x0) {
    *hashval_p = (uint)uVar2;
  }
  pvVar5 = (vm_lookup_val *)0x0;
  for (this_00 = *(vm_lookup_val **)(pcVar1 + uVar2 * 8 + 0x20); this_00 != (vm_lookup_val *)0x0;
      this_00 = this_00->nxt) {
    iVar4 = vm_val_t::equals(&this_00->key,key,0);
    if (iVar4 != 0) goto LAB_00269a3a;
    pvVar5 = this_00;
  }
  this_00 = (vm_lookup_val *)0x0;
LAB_00269a3a:
  if (prv_entry_p != (vm_lookup_val **)0x0) {
    *prv_entry_p = pvVar5;
  }
  return this_00;
}

Assistant:

vm_lookup_val *CVmObjLookupTable::find_entry(VMG_ const vm_val_t *key,
                                             uint *hashval_p,
                                             vm_lookup_val **prv_entry_p)
{
    vm_lookup_ext *ext = get_ext();
    uint hashval;
    vm_lookup_val *entry;
    vm_lookup_val *prv_entry;

    /* compute the hash value (and return it to the caller if desired) */
    hashval = calc_key_hash(vmg_ key);
    if (hashval_p != 0)
        *hashval_p = hashval;

    /* scan the hash chain for this entry */
    for (prv_entry = 0, entry = ext->buckets[hashval] ; entry != 0 ;
         prv_entry = entry, entry = entry->nxt)
    {
        /* if it matches the key we're looking for, this is the one */
        if (entry->key.equals(vmg_ key))
            break;
    }

    /* if the caller wanted to know the previous entry, tell them */
    if (prv_entry_p != 0)
        *prv_entry_p = prv_entry;

    /* return the entry where we found the key, if indeed we found it */
    return entry;
}